

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O0

void gdImageSkewY(gdImagePtr dst,gdImagePtr src,int uCol,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  uint uVar1;
  int local_bc;
  int local_b0;
  uint local_ac;
  uint local_a0;
  int local_9c;
  int local_90;
  int local_8c;
  int local_80;
  int local_7c;
  uint local_78;
  int local_74;
  int local_70;
  int local_6c;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int pxlSrc;
  int pxlLeft;
  int pxlOldLeft;
  FuncPtr f;
  int a;
  int b;
  int g;
  int r;
  int iYPos;
  int i;
  int ignoretransparent_local;
  int clrBack_local;
  double dWeight_local;
  int iOffset_local;
  int uCol_local;
  gdImagePtr src_local;
  gdImagePtr dst_local;
  
  g = 0;
  local_58 = 0;
  if (src->trueColor == 0) {
    _pxlLeft = gdImageGetPixel;
  }
  else {
    _pxlLeft = gdImageGetTrueColorPixel;
  }
  for (r = 0; r <= iOffset; r = r + 1) {
    gdImageSetPixel(dst,uCol,r,clrBack);
  }
  if (src->trueColor == 0) {
    local_60 = src->red[clrBack];
  }
  else {
    local_60 = (int)(clrBack & 0xff0000U) >> 0x10;
  }
  if (src->trueColor == 0) {
    local_64 = src->green[clrBack];
  }
  else {
    local_64 = (int)(clrBack & 0xff00U) >> 8;
  }
  if (src->trueColor == 0) {
    local_68 = src->blue[clrBack];
  }
  else {
    local_68 = clrBack & 0xff;
  }
  if (src->trueColor == 0) {
    local_6c = src->alpha[clrBack];
  }
  else {
    local_6c = (int)(clrBack & 0x7f000000U) >> 0x18;
  }
  pxlSrc = gdImageColorAllocateAlpha
                     (dst,(int)((double)local_60 * dWeight),(int)((double)local_64 * dWeight),
                      (int)((double)(int)local_68 * dWeight),(int)((double)local_6c * dWeight));
  for (r = 0; r < src->sy; r = r + 1) {
    uVar1 = (*_pxlLeft)(src,uCol,r);
    g = r + iOffset;
    if (src->trueColor == 0) {
      local_70 = src->red[(int)uVar1];
    }
    else {
      local_70 = (int)(uVar1 & 0xff0000) >> 0x10;
    }
    b = (int)((double)local_70 * dWeight);
    if (src->trueColor == 0) {
      local_74 = src->green[(int)uVar1];
    }
    else {
      local_74 = (int)(uVar1 & 0xff00) >> 8;
    }
    a = (int)((double)local_74 * dWeight);
    if (src->trueColor == 0) {
      local_78 = src->blue[(int)uVar1];
    }
    else {
      local_78 = uVar1 & 0xff;
    }
    f._4_4_ = (int)((double)(int)local_78 * dWeight);
    if (src->trueColor == 0) {
      local_7c = src->alpha[(int)uVar1];
    }
    else {
      local_7c = (int)(uVar1 & 0x7f000000) >> 0x18;
    }
    f._0_4_ = (int)((double)local_7c * dWeight);
    if (0xff < b) {
      b = 0xff;
    }
    if (0xff < a) {
      a = 0xff;
    }
    if (0xff < f._4_4_) {
      f._4_4_ = 0xff;
    }
    if (0x7f < (int)f) {
      f._0_4_ = 0x7f;
    }
    local_58 = (int)f * 0x1000000 + b * 0x10000 + a * 0x100 + f._4_4_;
    if (src->trueColor == 0) {
      local_80 = src->red[(int)uVar1];
    }
    else {
      local_80 = (int)(uVar1 & 0xff0000) >> 0x10;
    }
    if (src->trueColor == 0) {
      local_8c = src->red[pxlSrc];
    }
    else {
      local_8c = (int)(pxlSrc & 0xff0000U) >> 0x10;
    }
    b = local_80 - (b - local_8c);
    if (src->trueColor == 0) {
      local_90 = src->green[(int)uVar1];
    }
    else {
      local_90 = (int)(uVar1 & 0xff00) >> 8;
    }
    if (src->trueColor == 0) {
      local_9c = src->green[pxlSrc];
    }
    else {
      local_9c = (int)(pxlSrc & 0xff00U) >> 8;
    }
    a = local_90 - (a - local_9c);
    if (src->trueColor == 0) {
      local_a0 = src->blue[(int)uVar1];
    }
    else {
      local_a0 = uVar1 & 0xff;
    }
    if (src->trueColor == 0) {
      local_ac = src->blue[pxlSrc];
    }
    else {
      local_ac = pxlSrc & 0xff;
    }
    f._4_4_ = local_a0 - (f._4_4_ - local_ac);
    if (src->trueColor == 0) {
      local_b0 = src->alpha[(int)uVar1];
    }
    else {
      local_b0 = (int)(uVar1 & 0x7f000000) >> 0x18;
    }
    if (src->trueColor == 0) {
      local_bc = src->alpha[pxlSrc];
    }
    else {
      local_bc = (int)(pxlSrc & 0x7f000000U) >> 0x18;
    }
    f._0_4_ = local_b0 - ((int)f - local_bc);
    if (0xff < b) {
      b = 0xff;
    }
    if (0xff < a) {
      a = 0xff;
    }
    if (0xff < f._4_4_) {
      f._4_4_ = 0xff;
    }
    if (0x7f < (int)f) {
      f._0_4_ = 0x7f;
    }
    if ((ignoretransparent == 0) || (uVar1 != dst->transparent)) {
      local_5c = gdImageColorAllocateAlpha(dst,b,a,f._4_4_,(int)f);
      if (local_5c == -1) {
        local_5c = gdImageColorClosestAlpha(dst,b,a,f._4_4_,(int)f);
      }
    }
    else {
      local_5c = dst->transparent;
    }
    if ((-1 < g) && (g < dst->sy)) {
      gdImageSetPixel(dst,uCol,g,local_5c);
    }
    pxlSrc = local_58;
  }
  if (g < dst->sy) {
    gdImageSetPixel(dst,uCol,g,local_58);
  }
  r = g + -1;
  while (r = r + 1, r < dst->sy) {
    gdImageSetPixel(dst,uCol,r,clrBack);
  }
  return;
}

Assistant:

void gdImageSkewY (gdImagePtr dst, gdImagePtr src, int uCol, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, iYPos=0, r, g, b, a;
	FuncPtr f;
	int pxlOldLeft, pxlLeft=0, pxlSrc;

	if (src->trueColor) {
		f = gdImageGetTrueColorPixel;
	} else {
		f = gdImageGetPixel;
	}

	for (i = 0; i<=iOffset; i++) {
		gdImageSetPixel (dst, uCol, i, clrBack);
	}
	r = (int)((double)gdImageRed(src,clrBack) * dWeight);
	g = (int)((double)gdImageGreen(src,clrBack) * dWeight);
	b = (int)((double)gdImageBlue(src,clrBack) * dWeight);
	a = (int)((double)gdImageAlpha(src,clrBack) * dWeight);

	pxlOldLeft = gdImageColorAllocateAlpha(dst, r, g, b, a);

	for (i = 0; i < src->sy; i++) {
		pxlSrc = f (src, uCol, i);
		iYPos = i + iOffset;

		r = (int)((double)gdImageRed(src,pxlSrc) * dWeight);
		g = (int)((double)gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)((double)gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)((double)gdImageAlpha(src,pxlSrc) * dWeight);

		if (r>255) {
        	r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
    			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		pxlLeft = gdTrueColorAlpha(r, g, b, a);

		r = gdImageRed(src,pxlSrc)   - (r - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (g - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc)  - (b - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (a - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
        	r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
    			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((iYPos >= 0) && (iYPos < dst->sy)) {
			gdImageSetPixel (dst, uCol, iYPos, pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i = iYPos;
	if (i < dst->sy) {
		gdImageSetPixel (dst, uCol, i, pxlLeft);
	}

	i--;
	while (++i < dst->sy) {
		gdImageSetPixel (dst, uCol, i, clrBack);
	}
}